

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight)

{
  Expr *p_00;
  sqlite3 *in_RCX;
  sqlite3 *in_RDX;
  undefined4 in_ESI;
  Expr *p;
  undefined4 in_stack_fffffffffffffff0;
  
  p_00 = (Expr *)sqlite3DbMallocRawNN(in_RDX,(u64)in_RCX);
  if (p_00 == (Expr *)0x0) {
    sqlite3ExprDelete(in_RCX,(Expr *)0x0);
    sqlite3ExprDelete(in_RCX,p_00);
  }
  else {
    memset(p_00,0,0x48);
    p_00->op = (u8)in_ESI;
    p_00->iAgg = -1;
    sqlite3ExprAttachSubtrees
              ((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Expr *)in_RDX,(Expr *)in_RCX,
               p_00);
    sqlite3ExprCheckHeight((Parse *)in_RCX,(int)((ulong)p_00 >> 0x20));
  }
  return p_00;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight            /* Right operand */
){
  Expr *p;
  p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr));
  if( p ){
    memset(p, 0, sizeof(Expr));
    p->op = op & 0xff;
    p->iAgg = -1;
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }else{
    sqlite3ExprDelete(pParse->db, pLeft);
    sqlite3ExprDelete(pParse->db, pRight);
  }
  return p;
}